

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

string * __thiscall
libcellml::convertToString_abi_cxx11_
          (string *__return_storage_ptr__,libcellml *this,double value,bool fullPrecision)

{
  uint uVar1;
  _Setprecision _Var2;
  ostream *this_00;
  ostringstream local_1a8 [8];
  ostringstream strs;
  allocator<char> local_1a;
  byte local_19;
  double dStack_18;
  bool fullPrecision_local;
  double value_local;
  
  local_19 = (byte)this & 1;
  dStack_18 = value;
  value_local = (double)__return_storage_ptr__;
  uVar1 = std::isnan(value);
  if ((uVar1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    if ((local_19 & 1) == 0) {
      std::ostream::operator<<((ostream *)local_1a8,dStack_18);
    }
    else {
      _Var2 = std::setprecision(0xf);
      this_00 = std::operator<<((ostream *)local_1a8,_Var2);
      std::ostream::operator<<(this_00,dStack_18);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"nan",&local_1a);
    std::allocator<char>::~allocator(&local_1a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convertToString(double value, bool fullPrecision)
{
    if (std::isnan(value)) {
        // Always return "nan" whether we are dealing with +NAN or -NAN. This is to ensure that
        // the string representation of a NAN is consistent across compilers.
        return "nan";
    }
    std::ostringstream strs;
    if (fullPrecision) {
        strs << std::setprecision(std::numeric_limits<double>::digits10) << value;
    } else {
        strs << value;
    }
    return strs.str();
}